

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_hist.c
# Opt level: O1

void show_rate_histogram(rate_hist *hist,aom_codec_enc_cfg_t *cfg,int max_buckets)

{
  int buckets;
  
  if (cfg != (aom_codec_enc_cfg_t *)0x0 && hist != (rate_hist *)0x0) {
    show_rate_histogram_cold_1();
  }
  return;
}

Assistant:

void show_rate_histogram(struct rate_hist *hist, const aom_codec_enc_cfg_t *cfg,
                         int max_buckets) {
  int i, scale;
  int buckets = 0;

  if (hist == NULL || cfg == NULL) return;

  for (i = 0; i < RATE_BINS; i++) {
    if (hist->bucket[i].low == INT_MAX) continue;
    hist->bucket[buckets++] = hist->bucket[i];
  }

  fprintf(stderr, "\nRate (over %dms window):\n", cfg->rc_buf_sz);
  scale = merge_hist_buckets(hist->bucket, max_buckets, &buckets);
  show_histogram(hist->bucket, buckets, hist->total, scale);
}